

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

iterator __thiscall
eastl::vector<eastl::pair<int,_int>,_eastl::allocator>::insert
          (vector<eastl::pair<int,_int>,_eastl::allocator> *this,iterator position,value_type *value
          )

{
  pair<int,_int> *ppVar1;
  value_type *pvVar2;
  
  ppVar1 = (this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpBegin;
  pvVar2 = (this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpEnd;
  if ((pvVar2 == position) &&
     (pvVar2 != (this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpCapacity)) {
    (this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpEnd = pvVar2 + 1;
    *pvVar2 = *value;
  }
  else {
    DoInsertValue(this,position,value);
  }
  return (iterator)
         ((long)position +
         ((long)(this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpBegin -
         (long)ppVar1));
}

Assistant:

inline typename vector<T, Allocator>::iterator
    vector<T, Allocator>::insert(iterator position, const value_type& value)
    {
#if EASTL_ASSERT_ENABLED
            if(EASTL_UNLIKELY((position < mpBegin) || (position > mpEnd)))
                EASTL_FAIL_MSG("vector::insert -- invalid position");
#endif

        const ptrdiff_t n = position - mpBegin; // Save this because we might reallocate.

        if((mpEnd == mpCapacity) || (position != mpEnd))
            DoInsertValue(position, value);
        else
            ::new(mpEnd++) value_type(value);

        return mpBegin + n;
    }